

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_ThrustThingZ(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  long lVar1;
  long *plVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = (double)arg1 * 0.25;
  if (arg2 != 0) {
    dVar3 = -dVar3;
  }
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      return 0;
    }
    if (arg3 != 0) {
      dVar3 = dVar3 + (it->Vel).Z;
    }
    (it->Vel).Z = dVar3;
  }
  else {
    lVar1 = 0;
    while( true ) {
      plVar2 = (long *)(lVar1 + 0x288);
      if (lVar1 == 0) {
        plVar2 = (long *)((long)AActor::TIDHash + (ulong)((arg0 & 0x7fU) << 3));
      }
      for (lVar1 = *plVar2; (lVar1 != 0 && (*(int *)(lVar1 + 0x260) != arg0));
          lVar1 = *(long *)(lVar1 + 0x288)) {
      }
      if (lVar1 == 0) break;
      dVar4 = dVar3;
      if (arg3 != 0) {
        dVar4 = *(double *)(lVar1 + 0xb8) + dVar3;
      }
      *(double *)(lVar1 + 0xb8) = dVar4;
    }
  }
  return 1;
}

Assistant:

FUNC(LS_ThrustThingZ)	// [BC]
// ThrustThingZ (tid, zthrust, down/up, set)
{
	AActor *victim;
	double thrust = arg1/4.;

	// [BC] Up is default
	if (arg2)
		thrust = -thrust;

	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);

		while ( (victim = iterator.Next ()) )
		{
			if (!arg3)
				victim->Vel.Z = thrust;
			else
				victim->Vel.Z += thrust;
		}
		return true;
	}
	else if (it)
	{
		if (!arg3)
			it->Vel.Z = thrust;
		else
			it->Vel.Z += thrust;
		return true;
	}
	return false;
}